

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::ComputeMulRange::operator()
          (ComputeMulRange *this,Random *rnd,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  bool bVar1;
  int i;
  int iVar2;
  float fVar3;
  float fVar4;
  float scaledMax;
  float scaledMin;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  local_34 = getQuantizedFloat(rnd,0.25,2.0,0.25);
  local_38 = dstMin / local_34;
  local_3c = dstMax / local_34;
  bVar1 = quantizeFloatRange(&local_38,&local_3c);
  if (!bVar1) {
    local_34 = 1.0;
    local_3c = dstMax;
    local_38 = dstMin;
  }
  local_2c = getQuantizedFloat(rnd,0.0,local_3c - local_38,0.25);
  local_30 = local_38;
  fVar3 = getQuantizedFloat(rnd,0.0,(local_3c - local_38) - local_2c,0.25);
  *aMin = fVar3 + local_30;
  *aMax = fVar3 + local_30 + local_2c;
  *bMin = local_34;
  *bMax = local_34;
  for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
    fVar3 = *aMin;
    fVar4 = (float)iVar2 * -0.25 + local_34;
    if ((((dstMin <= fVar4 * fVar3) && (fVar4 * fVar3 < dstMax)) && (dstMin <= *aMax * fVar4)) &&
       (*aMax * fVar4 < dstMax)) {
      *bMin = fVar4;
      fVar3 = *aMin;
    }
    fVar4 = (float)iVar2 * 0.25 + local_34;
    if (((dstMin <= fVar3 * fVar4) && (fVar3 * fVar4 < dstMax)) &&
       ((dstMin <= *aMax * fVar4 && (*aMax * fVar4 < dstMax)))) {
      *bMax = fVar4;
    }
  }
  bVar1 = de::Random::getBool(rnd);
  if (bVar1) {
    fVar3 = *aMin;
    *aMin = *aMax;
    *aMax = fVar3;
    fVar3 = *bMin;
    *bMin = *bMax;
    *bMax = fVar3;
    *aMin = -*aMin;
    *aMax = -*aMax;
    *bMin = -*bMin;
    *bMax = -*bMax;
  }
  return;
}

Assistant:

void ComputeMulRange::operator() (de::Random& rnd, float dstMin, float dstMax, float& aMin, float& aMax, float& bMin, float& bMax) const
{
	const float minScale	 = 0.25f;
	const float maxScale	 = 2.0f;
	const float subRangeStep = 0.25f;
	const float scaleStep	 = 0.25f;

	float scale		= getQuantizedFloat(rnd, minScale, maxScale, scaleStep);
	float scaledMin	= dstMin/scale;
	float scaledMax	= dstMax/scale;

	// Quantize scaled value range if possible
	if (!quantizeFloatRange(scaledMin, scaledMax))
	{
		// Fall back to 1.0 as a scale
		scale		= 1.0f;
		scaledMin	= dstMin;
		scaledMax	= dstMax;
	}

	float subRangeLen = getQuantizedFloat(rnd, 0.0f, scaledMax-scaledMin, subRangeStep);
	aMin = scaledMin + getQuantizedFloat(rnd, 0.0f, (scaledMax-scaledMin)-subRangeLen, subRangeStep);
	aMax = aMin + subRangeLen;

	// Find scale range
	bMin = scale;
	bMax = scale;
	for (int i = 0; i < 5; i++)
	{
		if (de::inBounds(aMin*(scale-(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale-(float)i*scaleStep), dstMin, dstMax))
			bMin = scale-(float)i*scaleStep;

		if (de::inBounds(aMin*(scale+(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale+(float)i*scaleStep), dstMin, dstMax))
			bMax = scale+(float)i*scaleStep;
	}

	// Negative scale?
	if (rnd.getBool())
	{
		std::swap(aMin, aMax);
		std::swap(bMin, bMax);
		aMin	*= -1.0f;
		aMax	*= -1.0f;
		bMin	*= -1.0f;
		bMax	*= -1.0f;
	}

#if defined(DE_DEBUG)
	const float eps = 0.001f;
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin*bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMax, dstMin-eps, dstMax+eps));
#endif
}